

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::read_piece(torrent *this,piece_index_t piece)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  error_category *peVar5;
  undefined4 extraout_var;
  element_type *this_00;
  undefined4 extraout_var_00;
  element_type *peVar6;
  char *p;
  undefined4 extraout_var_01;
  session_settings *this_01;
  int *piVar7;
  undefined4 extraout_var_02;
  anon_class_48_3_eaeca597 local_140;
  function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)> local_110;
  uint local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  undefined1 local_e0 [4];
  int i;
  shared_ptr<libtorrent::aux::torrent> self;
  int iStack_c8;
  peer_request r;
  bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void> local_b5;
  int read_mode;
  undefined1 local_b0 [3];
  disk_job_flags_t flags;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  shared_ptr<libtorrent::aux::torrent::read_piece_struct> rp;
  undefined1 local_78 [24];
  shared_array<char> buf;
  int blocks_in_piece;
  int piece_size;
  undefined1 local_40 [24];
  undefined1 local_28 [8];
  error_code ec;
  torrent *this_local;
  piece_index_t piece_local;
  
  ec.cat_ = (error_category *)this;
  this_local._4_4_ = piece.m_val;
  boost::system::error_code::error_code((error_code *)local_28);
  if (((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) &&
     ((*(uint *)&this->field_0x5dd >> 0x1a & 1) == 0)) {
    bVar1 = valid_metadata(this);
    if (bVar1) {
      local_40._20_4_ = this_local._4_4_;
      bVar1 = has_piece_passed(this,this_local._4_4_);
      if (!bVar1) {
        peVar5 = libtorrent_category();
        boost::system::error_code::assign((error_code *)local_28,0x8d,peVar5);
      }
    }
    else {
      peVar5 = libtorrent_category();
      boost::system::error_code::assign((error_code *)local_28,0x6d,peVar5);
    }
  }
  else {
    peVar5 = boost::system::generic_category();
    boost::system::error_code::assign((error_code *)local_28,0x7d,peVar5);
  }
  bVar1 = boost::system::error_code::operator_cast_to_bool((error_code *)local_28);
  if (bVar1) {
    iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
              [5])();
    get_handle((torrent *)local_40);
    alert_manager::
    emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code&>
              ((alert_manager *)CONCAT44(extraout_var,iVar2),(torrent_handle *)local_40,
               (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
               ((long)&this_local + 4),(error_code *)local_28);
    torrent_handle::~torrent_handle((torrent_handle *)local_40);
  }
  else {
    this_00 = ::std::
              __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)&(this->super_torrent_hot_members).m_torrent_file);
    buf.pn.pi_._4_4_ = this_local._4_4_;
    iVar2 = torrent_info::piece_size(this_00,this_local._4_4_);
    iVar3 = block_size(this);
    iVar4 = block_size(this);
    buf.pn.pi_._0_4_ = (iVar2 + iVar3 + -1) / iVar4;
    if ((int)buf.pn.pi_ == 0) {
      boost::shared_array<char>::shared_array((shared_array<char> *)(local_78 + 0x10));
      iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[5])();
      get_handle((torrent *)local_78);
      rp.super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi._4_4_ = 0;
      alert_manager::
      emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::shared_array<char>&,int>
                ((alert_manager *)CONCAT44(extraout_var_00,iVar2),(torrent_handle *)local_78,
                 (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                 ((long)&this_local + 4),(shared_array<char> *)(local_78 + 0x10),
                 (int *)((long)&rp.
                                super___shared_ptr<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 4));
      torrent_handle::~torrent_handle((torrent_handle *)local_78);
      boost::shared_array<char>::~shared_array((shared_array<char> *)(local_78 + 0x10));
    }
    else {
      ::std::make_shared<libtorrent::aux::torrent::read_piece_struct>();
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      p = (char *)operator_new__((long)iVar2,(nothrow_t *)&::std::nothrow);
      boost::shared_array<char>::reset<char>(&peVar6->piece_data,p);
      peVar6 = ::std::
               __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_90);
      bVar1 = boost::shared_array<char>::operator!(&peVar6->piece_data);
      iVar3 = (int)buf.pn.pi_;
      if (bVar1) {
        iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                  _vptr_session_logger[5])();
        get_handle((torrent *)local_a0);
        peVar5 = boost::system::generic_category();
        boost::system::error_code::error_code((error_code *)local_b0,0xc,peVar5);
        alert_manager::
        emplace_alert<libtorrent::read_piece_alert,libtorrent::torrent_handle,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&,boost::system::error_code>
                  ((alert_manager *)CONCAT44(extraout_var_01,iVar2),(torrent_handle *)local_a0,
                   (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *)
                   ((long)&this_local + 4),(error_code *)local_b0);
        torrent_handle::~torrent_handle((torrent_handle *)local_a0);
        read_mode = 1;
      }
      else {
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_90);
        peVar6->blocks_left = iVar3;
        peVar6 = ::std::
                 __shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<libtorrent::aux::torrent::read_piece_struct,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_90);
        peVar6->fail = false;
        libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
        bitfield_flag(&local_b5);
        this_01 = settings(this);
        iVar3 = session_settings::get_int(this_01,0x4025);
        if (iVar3 == 2) {
          libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>::
          operator|=(&local_b5,
                     (bitfield_flag<unsigned_char,_libtorrent::disk_job_flags_tag,_void>)'\x10');
        }
        self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi._4_4_ = this_local._4_4_;
        iStack_c8 = 0;
        ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this
                  ((enable_shared_from_this<libtorrent::aux::torrent> *)local_e0);
        local_e4 = 0;
        while (local_e4 < (int)buf.pn.pi_) {
          local_e8 = iVar2 - iStack_c8;
          local_ec = block_size(this);
          piVar7 = ::std::min<int>(&local_e8,&local_ec);
          iVar3 = *piVar7;
          iVar4 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                    _vptr_session_logger[4])();
          local_f0 = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
          ::std::shared_ptr<libtorrent::aux::torrent>::shared_ptr
                    (&local_140.self,(shared_ptr<libtorrent::aux::torrent> *)local_e0);
          local_140.r.start = iStack_c8;
          local_140.r.piece.m_val =
               self.super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi._4_4_;
          local_140.r.length = iVar3;
          ::std::shared_ptr<libtorrent::aux::torrent::read_piece_struct>::shared_ptr
                    (&local_140.rp,
                     (shared_ptr<libtorrent::aux::torrent::read_piece_struct> *)local_90);
          ::std::function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>::
          function<libtorrent::aux::torrent::read_piece(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)::__0,void>
                    ((function<void(libtorrent::disk_buffer_holder,libtorrent::storage_error_const&)>
                      *)&local_110,&local_140);
          (**(code **)(*(long *)CONCAT44(extraout_var_02,iVar4) + 0x10))
                    ((long *)CONCAT44(extraout_var_02,iVar4),local_f0,
                     (undefined1 *)
                     ((long)&self.
                             super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi + 4),&local_110,local_b5.m_val);
          ::std::function<void_(libtorrent::disk_buffer_holder,_const_libtorrent::storage_error_&)>
          ::~function(&local_110);
          read_piece(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)::
          $_0::~__0((__0 *)&local_140);
          local_e4 = local_e4 + 1;
          iVar3 = block_size(this);
          iStack_c8 = iVar3 + iStack_c8;
        }
        (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
          [0x1f])();
        ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                  ((shared_ptr<libtorrent::aux::torrent> *)local_e0);
        read_mode = 0;
      }
      ::std::shared_ptr<libtorrent::aux::torrent::read_piece_struct>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent::read_piece_struct> *)local_90);
    }
  }
  return;
}

Assistant:

void torrent::read_piece(piece_index_t const piece)
	{
		error_code ec;
		if (m_abort || m_deleted)
		{
			ec.assign(boost::system::errc::operation_canceled, generic_category());
		}
		else if (!valid_metadata())
		{
			ec.assign(errors::no_metadata, libtorrent_category());
		}
		else if (!has_piece_passed(piece))
		{
			ec.assign(errors::invalid_piece_index, libtorrent_category());
		}

		if (ec)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(get_handle(), piece, ec);
			return;
		}

		const int piece_size = m_torrent_file->piece_size(piece);
		const int blocks_in_piece = (piece_size + block_size() - 1) / block_size();

		TORRENT_ASSERT(blocks_in_piece > 0);
		TORRENT_ASSERT(piece_size > 0);

		if (blocks_in_piece == 0)
		{
			// this shouldn't actually happen
			boost::shared_array<char> buf;
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, buf, 0);
			return;
		}

		std::shared_ptr<read_piece_struct> rp = std::make_shared<read_piece_struct>();
		rp->piece_data.reset(new (std::nothrow) char[std::size_t(piece_size)]);
		if (!rp->piece_data)
		{
			m_ses.alerts().emplace_alert<read_piece_alert>(
				get_handle(), piece, error_code(boost::system::errc::not_enough_memory, generic_category()));
			return;
		}
		rp->blocks_left = blocks_in_piece;
		rp->fail = false;

		disk_job_flags_t flags{};
		auto const read_mode = settings().get_int(settings_pack::disk_io_read_mode);
		if (read_mode == settings_pack::disable_os_cache)
			flags |= disk_interface::volatile_read;

		peer_request r;
		r.piece = piece;
		r.start = 0;
		auto self = shared_from_this();
		for (int i = 0; i < blocks_in_piece; ++i, r.start += block_size())
		{
			r.length = std::min(piece_size - r.start, block_size());
			m_ses.disk_thread().async_read(m_storage, r
				, [self, r, rp](disk_buffer_holder block, storage_error const& se) mutable
				{ self->on_disk_read_complete(std::move(block), se, r, rp); }
				, flags);
		}
		m_ses.deferred_submit_jobs();
	}